

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::TabBarProcessReorder(ImGuiTabBar *tab_bar)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  float fVar5;
  float fVar6;
  ImS16 IVar7;
  ImS16 IVar8;
  ImGuiID IVar9;
  ImGuiTabItemFlags IVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  ImGuiID IVar14;
  ImGuiTabItemFlags IVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  ImGuiTabItem *it;
  ImGuiTabItem *pIVar19;
  ImGuiTabItem item_tmp;
  undefined1 uStack_19;
  
  it = TabBarFindTabByID(tab_bar,tab_bar->ReorderRequestTabId);
  if ((it != (ImGuiTabItem *)0x0) && ((it->Flags & 0x20) == 0)) {
    iVar18 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,it);
    iVar18 = tab_bar->ReorderRequestDir + iVar18;
    if ((-1 < iVar18) && (iVar18 < (tab_bar->Tabs).Size)) {
      pIVar19 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar18);
      if (((pIVar19->Flags & 0x20U) == 0) && (((pIVar19->Flags ^ it->Flags) & 0xc0U) == 0)) {
        uVar1._0_2_ = it->IndexDuringLayout;
        uVar1._2_1_ = it->WantClose;
        uVar1._3_1_ = it->field_0x23;
        IVar14 = it->ID;
        IVar15 = it->Flags;
        iVar16 = it->LastFrameVisible;
        iVar17 = it->LastFrameSelected;
        fVar12 = it->Offset;
        fVar13 = it->Width;
        uVar2 = it->ContentWidth;
        uVar3 = it->NameOffset;
        uVar4 = it->BeginOrder;
        uStack_19 = (undefined1)((ushort)uVar4 >> 8);
        *(undefined4 *)((long)&it->BeginOrder + 1) = *(undefined4 *)((long)&pIVar19->BeginOrder + 1)
        ;
        IVar9 = pIVar19->ID;
        IVar10 = pIVar19->Flags;
        iVar18 = pIVar19->LastFrameVisible;
        iVar11 = pIVar19->LastFrameSelected;
        fVar5 = pIVar19->Width;
        fVar6 = pIVar19->ContentWidth;
        IVar7 = pIVar19->NameOffset;
        IVar8 = pIVar19->BeginOrder;
        it->Offset = pIVar19->Offset;
        it->Width = fVar5;
        it->ContentWidth = fVar6;
        it->NameOffset = IVar7;
        it->BeginOrder = IVar8;
        it->ID = IVar9;
        it->Flags = IVar10;
        it->LastFrameVisible = iVar18;
        it->LastFrameSelected = iVar11;
        *(uint *)((long)&pIVar19->BeginOrder + 1) = CONCAT31((int3)uVar1,uStack_19);
        pIVar19->Offset = fVar12;
        pIVar19->Width = fVar13;
        pIVar19->ContentWidth = (float)uVar2;
        pIVar19->NameOffset = uVar3;
        pIVar19->BeginOrder = uVar4;
        pIVar19->ID = IVar14;
        pIVar19->Flags = IVar15;
        pIVar19->LastFrameVisible = iVar16;
        pIVar19->LastFrameSelected = iVar17;
        if ((tab_bar->Flags & 0x400000) != 0) {
          MarkIniSettingsDirty();
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ImGui::TabBarProcessReorder(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId);
    if (tab1 == NULL || (tab1->Flags & ImGuiTabItemFlags_NoReorder))
        return false;

    //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
    int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestDir;
    if (tab2_order < 0 || tab2_order >= tab_bar->Tabs.Size)
        return false;

    // Reordered TabItem must share the same position flags than target
    ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
    if (tab2->Flags & ImGuiTabItemFlags_NoReorder)
        return false;
    if ((tab1->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (tab2->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)))
        return false;

    ImGuiTabItem item_tmp = *tab1;
    *tab1 = *tab2;
    *tab2 = item_tmp;

    if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
        MarkIniSettingsDirty();
    return true;
}